

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# junit_log_formatter.hpp
# Opt level: O1

junit_log_helper * __thiscall
boost::unit_test::output::junit_log_formatter::get_current_log_entry(junit_log_formatter *this)

{
  _Rb_tree_header *p_Var1;
  _List_node_base *p_Var2;
  junit_log_helper *pjVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  
  if ((this->list_path_to_root).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&this->list_path_to_root)
  {
    return &this->runner_log_entry;
  }
  p_Var5 = (this->map_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = (this->list_path_to_root).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
  p_Var1 = &(this->map_tests)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = &p_Var1->_M_header;
  if (p_Var5 != (_Base_ptr)0x0) {
    do {
      bVar6 = *(_List_node_base **)(p_Var5 + 1) < p_Var2[1]._M_next;
      if (!bVar6) {
        p_Var4 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[bVar6];
    } while (p_Var5 != (_Base_ptr)0x0);
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (p_Var5 = p_Var4, p_Var2[1]._M_next < *(_List_node_base **)(p_Var4 + 1))) {
    p_Var5 = &p_Var1->_M_header;
  }
  pjVar3 = (junit_log_helper *)&p_Var5[1]._M_parent;
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    pjVar3 = &this->runner_log_entry;
  }
  return pjVar3;
}

Assistant:

junit_impl::junit_log_helper& get_current_log_entry() {
        if(list_path_to_root.empty())
            return runner_log_entry;
        map_trace_t::iterator it = map_tests.find(list_path_to_root.back());
        return (it == map_tests.end() ? runner_log_entry : it->second);
    }